

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O0

tnt_error tnt_io_connect_do(tnt_stream_net *s,sockaddr *addr,socklen_t addr_size)

{
  int iVar1;
  tnt_error tVar2;
  int *piVar3;
  int local_7c;
  socklen_t local_64;
  int local_60;
  socklen_t len;
  int opt;
  int passed_time;
  timeval curr;
  int ret;
  pollfd fds [1];
  int timeout;
  timeval start_connect;
  tnt_error result;
  socklen_t addr_size_local;
  sockaddr *addr_local;
  tnt_stream_net *s_local;
  
  s_local._4_4_ = tnt_io_nonblock(s,1);
  if (s_local._4_4_ == TNT_EOK) {
    iVar1 = connect(s->fd,(sockaddr *)addr,addr_size);
    if (iVar1 == -1) {
      piVar3 = __errno_location();
      if (*piVar3 == 0x73) {
        iVar1 = gettimeofday((timeval *)&fds[0].events,(__timezone_ptr_t)0x0);
        if (iVar1 == -1) {
          piVar3 = __errno_location();
          s->errno_ = *piVar3;
          s_local._4_4_ = TNT_ESYSTEM;
        }
        else {
          fds[0].fd = (int)(s->opt).tmout_connect.tv_sec * 1000 +
                      (int)((s->opt).tmout_connect.tv_usec / 1000);
          do {
            curr.tv_usec._4_4_ = s->fd;
            curr.tv_usec._0_4_ = poll((pollfd *)((long)&curr.tv_usec + 4),1,fds[0].fd);
            if ((int)curr.tv_usec != -1) {
              if ((int)curr.tv_usec == 0) {
                return TNT_ETMOUT;
              }
              local_60 = 0;
              local_64 = 4;
              iVar1 = getsockopt(s->fd,1,4,&local_60,&local_64);
              if ((iVar1 != -1) && (local_60 == 0)) {
                tVar2 = tnt_io_nonblock(s,0);
                if (tVar2 != TNT_EOK) {
                  return tVar2;
                }
                return TNT_EOK;
              }
              if (local_60 == 0) {
                piVar3 = __errno_location();
                local_7c = *piVar3;
              }
              else {
                local_7c = local_60;
              }
              s->errno_ = local_7c;
              return TNT_ESYSTEM;
            }
            piVar3 = __errno_location();
            if ((*piVar3 != 4) && (piVar3 = __errno_location(), *piVar3 != 0xb)) {
              piVar3 = __errno_location();
              s->errno_ = *piVar3;
              return TNT_ESYSTEM;
            }
            iVar1 = gettimeofday((timeval *)&opt,(__timezone_ptr_t)0x0);
            if (iVar1 == -1) {
              piVar3 = __errno_location();
              s->errno_ = *piVar3;
              return TNT_ESYSTEM;
            }
            len = ((int)_opt - (int)stack0xffffffffffffffc8) * 1000 +
                  (int)((curr.tv_sec - start_connect.tv_sec) / 1000);
          } while ((int)len < fds[0].fd);
          s_local._4_4_ = TNT_ETMOUT;
        }
      }
      else {
        piVar3 = __errno_location();
        s->errno_ = *piVar3;
        s_local._4_4_ = TNT_ESYSTEM;
      }
    }
    else {
      s_local._4_4_ = TNT_EOK;
    }
  }
  return s_local._4_4_;
}

Assistant:

static enum tnt_error
tnt_io_connect_do(struct tnt_stream_net *s, struct sockaddr *addr,
		       socklen_t addr_size)
{
	/* setting nonblock */
	enum tnt_error result = tnt_io_nonblock(s, 1);
	if (result != TNT_EOK)
		return result;

	if (connect(s->fd, (struct sockaddr*)addr, addr_size) != -1)
		return TNT_EOK;
	if (errno == EINPROGRESS) {
		/* get start connect time */
		struct timeval start_connect;
		if (gettimeofday(&start_connect, NULL) == -1) {
			s->errno_ = errno;
			return TNT_ESYSTEM;
		}
		/* set initial timer */
		int timeout = TIMEVAL_TO_MSEC(s->opt.tmout_connect);
		while (1) {
			struct pollfd fds[1];
			fds[0].fd = s->fd;
			fds[0].events = POLLOUT;
			int ret = poll(fds, 1, timeout);
			if (ret == -1) {
				if (errno == EINTR || errno == EAGAIN) {
					/* get current time */
					struct timeval curr;
					if (gettimeofday(&curr, NULL) == -1) {
						s->errno_ = errno;
						return TNT_ESYSTEM;
					}
					/* check timeout */
					int passed_time = TIMEVAL_DIFF_MSEC(
						curr, start_connect);
					if (passed_time >= timeout) {
						/* timeout */
						return TNT_ETMOUT;
					}
				} else {
					s->errno_ = errno;
					return TNT_ESYSTEM;
				}
			} else if (ret == 0) {
				/* timeout */
				return TNT_ETMOUT;
			} else {
				/* we have a event on socket */
				break;
			}
		}
		/* checking error status */
		int opt = 0;
		socklen_t len = sizeof(opt);
		if ((getsockopt(s->fd, SOL_SOCKET, SO_ERROR,
				&opt, &len) == -1) || opt) {
			s->errno_ = (opt) ? opt : errno;
			return TNT_ESYSTEM;
		}
	} else {
		s->errno_ = errno;
		return TNT_ESYSTEM;
	}

	/* setting block */
	result = tnt_io_nonblock(s, 0);
	if (result != TNT_EOK)
		return result;
	return TNT_EOK;
}